

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testcrypt.c
# Opt level: O3

void handle_checkenum(BinarySource *in,strbuf *out)

{
  long lVar1;
  _Bool _Var2;
  bool bVar3;
  long lVar4;
  size_t sVar5;
  bool bVar6;
  char *__s;
  ptrlen pVar7;
  ptrlen pl;
  
  pVar7 = get_word(in);
  pl = get_word(in);
  _Var2 = ptrlen_eq_string(pVar7,"hashalg");
  if (_Var2) {
    _Var2 = ptrlen_eq_string(pl,"md5");
    bVar3 = true;
    if (!_Var2) {
      lVar4 = 0x10;
      do {
        lVar1 = lVar4 + 0x10;
        bVar3 = lVar1 != 0x120;
        if (lVar1 == 0x120) break;
        _Var2 = ptrlen_eq_string(pl,*(char **)(enum_translate_hashalg_mapping + lVar4));
        lVar4 = lVar1;
      } while (!_Var2);
    }
  }
  else {
    bVar3 = false;
  }
  _Var2 = ptrlen_eq_string(pVar7,"macalg");
  if (_Var2) {
    _Var2 = ptrlen_eq_string(pl,"hmac_md5");
    bVar3 = true;
    if (!_Var2) {
      lVar4 = 0x10;
      do {
        lVar1 = lVar4 + 0x10;
        bVar3 = lVar1 != 0x80;
        if (lVar1 == 0x80) break;
        _Var2 = ptrlen_eq_string(pl,*(char **)(enum_translate_macalg_mapping + lVar4));
        lVar4 = lVar1;
      } while (!_Var2);
    }
  }
  _Var2 = ptrlen_eq_string(pVar7,"keyalg");
  if (_Var2) {
    _Var2 = ptrlen_eq_string(pl,"dsa");
    bVar3 = true;
    if (!_Var2) {
      lVar4 = 0x10;
      do {
        lVar1 = lVar4 + 0x10;
        bVar3 = lVar1 != 0xe0;
        if (lVar1 == 0xe0) break;
        _Var2 = ptrlen_eq_string(pl,*(char **)(enum_translate_keyalg_mapping + lVar4));
        lVar4 = lVar1;
      } while (!_Var2);
    }
  }
  _Var2 = ptrlen_eq_string(pVar7,"cipheralg");
  if (_Var2) {
    _Var2 = ptrlen_eq_string(pl,"3des_ctr");
    bVar3 = true;
    if (!_Var2) {
      lVar4 = 0x10;
      do {
        lVar1 = lVar4 + 0x10;
        bVar3 = lVar1 != 0x1d0;
        if (lVar1 == 0x1d0) break;
        _Var2 = ptrlen_eq_string(pl,*(char **)(enum_translate_cipheralg_mapping + lVar4));
        lVar4 = lVar1;
      } while (!_Var2);
    }
  }
  _Var2 = ptrlen_eq_string(pVar7,"dh_group");
  if (_Var2) {
    bVar6 = false;
    lVar4 = 0;
    do {
      bVar3 = ptrlen_eq_string(pl,(&enum_translate_dh_group_mapping)[lVar4 * 2]);
      if (bVar6) break;
      lVar4 = 1;
      bVar6 = true;
    } while (!bVar3);
  }
  _Var2 = ptrlen_eq_string(pVar7,"ecdh_alg");
  if (_Var2) {
    _Var2 = ptrlen_eq_string(pl,"curve25519");
    bVar3 = true;
    if (!_Var2) {
      lVar4 = 0x10;
      do {
        lVar1 = lVar4 + 0x10;
        bVar3 = lVar1 != 0x60;
        if (lVar1 == 0x60) break;
        _Var2 = ptrlen_eq_string(pl,*(char **)(enum_translate_ecdh_alg_mapping + lVar4));
        lVar4 = lVar1;
      } while (!_Var2);
    }
  }
  _Var2 = ptrlen_eq_string(pVar7,"rsaorder");
  if (_Var2) {
    bVar6 = false;
    lVar4 = 0;
    do {
      bVar3 = ptrlen_eq_string(pl,(&enum_translate_rsaorder_mapping)[lVar4 * 2]);
      if (bVar6) break;
      lVar4 = 1;
      bVar6 = true;
    } while (!bVar3);
  }
  _Var2 = ptrlen_eq_string(pVar7,"primegenpolicy");
  if (_Var2) {
    _Var2 = ptrlen_eq_string(pl,"probabilistic");
    bVar3 = true;
    if (!_Var2) {
      lVar4 = 0;
      do {
        lVar1 = lVar4 + 0x10;
        bVar3 = lVar1 != 0x40;
        if (lVar1 == 0x40) break;
        _Var2 = ptrlen_eq_string(pl,*(char **)(enum_translate_primegenpolicy_mapping + lVar4 + 0x10)
                                );
        lVar4 = lVar1;
      } while (!_Var2);
    }
  }
  _Var2 = ptrlen_eq_string(pVar7,"argon2flavour");
  if (_Var2) {
    _Var2 = ptrlen_eq_string(pl,"d");
    bVar3 = true;
    if (!_Var2) {
      lVar4 = 0x10;
      do {
        lVar1 = lVar4 + 0x10;
        bVar3 = lVar1 != 0xa0;
        if (lVar1 == 0xa0) break;
        _Var2 = ptrlen_eq_string(pl,*(char **)(enum_translate_argon2flavour_mapping + lVar4));
        lVar4 = lVar1;
      } while (!_Var2);
    }
  }
  _Var2 = ptrlen_eq_string(pVar7,"fptype");
  if (_Var2) {
    bVar6 = false;
    lVar4 = 0;
    do {
      bVar3 = ptrlen_eq_string(pl,(char *)(&enum_translate_fptype_mapping)[lVar4 * 2]);
      if (bVar6) break;
      lVar4 = 1;
      bVar6 = true;
    } while (!bVar3);
  }
  _Var2 = ptrlen_eq_string(pVar7,"httpdigesthash");
  if (_Var2) {
    _Var2 = ptrlen_eq_string(pl,"MD5");
    bVar3 = true;
    if (!_Var2) {
      __s = "bad\n";
      lVar4 = 0x10;
      do {
        if (lVar4 + 0x10 == 0x40) goto LAB_0010e7a2;
        _Var2 = ptrlen_eq_string(pl,*(char **)(enum_translate_httpdigesthash_mapping + lVar4));
        lVar4 = lVar4 + 0x10;
      } while (!_Var2);
    }
  }
  __s = "bad\n";
  if (bVar3 != false) {
    __s = "ok\n";
  }
LAB_0010e7a2:
  sVar5 = strlen(__s);
  pVar7.len = sVar5;
  pVar7.ptr = __s;
  BinarySink_put_datapl(out->binarysink_,pVar7);
  return;
}

Assistant:

static void handle_checkenum(BinarySource *in, strbuf *out)
{
    ptrlen type = get_word(in);
    ptrlen value = get_word(in);
    bool ok = false;

    #define BEGIN_ENUM_TYPE(name) \
    if (ptrlen_eq_string(type, #name))                  \
        ok = enum_translate_##name(value, NULL);
    #define ENUM_VALUE(name, value)
    #define END_ENUM_TYPE(name)
    #include "testcrypt-enum.h"
    #undef BEGIN_ENUM_TYPE
    #undef ENUM_VALUE
    #undef END_ENUM_TYPE

    put_dataz(out, ok ? "ok\n" : "bad\n");
}